

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_3_2::TypedAttribute<Imf_3_2::ChannelList>::TypedAttribute
          (TypedAttribute<Imf_3_2::ChannelList> *this)

{
  _Rb_tree_header *p_Var1;
  
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_003d3138;
  p_Var1 = &(this->_value)._map._M_t._M_impl.super__Rb_tree_header;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TypedAttribute (const TypedAttribute<T>& other) = default;